

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  byte bVar1;
  _7zip *zip;
  uchar *puVar2;
  size_t sVar3;
  uint64_t uVar4;
  Bool BVar5;
  uint32_t uVar6;
  uchar *puVar7;
  uint8_t *__src;
  uint64_t uVar8;
  unsigned_long uVar9;
  ssize_t sVar10;
  undefined8 uVar11;
  void *pvVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *limit;
  size_t sVar16;
  char *pcVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uchar *outBuf;
  uchar *puVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  size_t outSize;
  ulong uVar31;
  size_t sVar32;
  bool bVar33;
  ulong local_f0;
  uint local_d8;
  ulong local_b0;
  ulong local_a8;
  uchar *local_a0;
  code *local_98;
  IByteIn *local_90;
  size_t local_88;
  z_stream *local_80;
  size_t local_78;
  CPpmd7 *local_70;
  code *local_68;
  uchar *local_60;
  ulong local_58;
  long local_50;
  ZSTD_inBuffer input;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar12 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_b0);
    if (0 < (long)local_b0 && pvVar12 != (void *)0x0) {
      uVar31 = zip->folder_outbytes_remaining;
      uVar15 = zip->pack_stream_inbytes_remaining;
      if (uVar15 <= local_b0) {
        local_b0 = uVar15;
      }
      zip->pack_stream_inbytes_remaining = uVar15 - local_b0;
      if (uVar31 <= local_b0) {
        local_b0 = uVar31;
      }
      zip->folder_outbytes_remaining = uVar31 - local_b0;
      zip->uncompressed_buffer_bytes_remaining = local_b0;
      return 0;
    }
    pcVar17 = "Truncated 7-Zip file body";
    iVar21 = 0x54;
LAB_001674db:
    archive_set_error(&a->archive,iVar21,pcVar17);
  }
  else {
    puVar7 = zip->uncompressed_buffer;
    if (puVar7 == (uchar *)0x0) {
      sVar16 = 0x10000;
      if (0x10000 < minimum) {
        sVar16 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar16;
      puVar7 = (uchar *)malloc(sVar16);
      zip->uncompressed_buffer = puVar7;
      if (puVar7 == (uchar *)0x0) {
LAB_00167496:
        pcVar17 = "No memory for 7-Zip decompression";
        iVar21 = 0xc;
        goto LAB_001674db;
      }
LAB_00166888:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else {
      if ((minimum <= zip->uncompressed_buffer_size) &&
         (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_00166888;
      lVar23 = (long)zip->uncompressed_buffer_pointer - (long)puVar7;
      if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
        lVar23 = 0;
      }
      if (zip->uncompressed_buffer_size < minimum) {
        uVar31 = minimum + 0x3ff & 0xfffffffffffffc00;
        puVar7 = (uchar *)realloc(puVar7,uVar31);
        if (puVar7 == (uchar *)0x0) goto LAB_00167496;
        zip->uncompressed_buffer = puVar7;
        zip->uncompressed_buffer_size = uVar31;
      }
      if (lVar23 != 0) {
        memmove(puVar7,puVar7 + lVar23,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_a0 = zip->odd_bcj;
    local_90 = &zip->bytein;
    local_98 = Ppmd7z_RangeDec_Init;
    local_68 = Ppmd7_DecodeSymbol;
    local_70 = &zip->ppmd7_context;
    local_80 = &zip->stream;
    local_88 = minimum;
    while (__src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b0), 0 < (long)local_b0) {
      puVar2 = zip->uncompressed_buffer;
      sVar3 = zip->uncompressed_buffer_bytes_remaining;
      puVar7 = puVar2 + sVar3;
      uVar30 = zip->uncompressed_buffer_size - sVar3;
      uVar31 = zip->pack_stream_inbytes_remaining;
      uVar15 = local_b0;
      if (uVar31 <= local_b0) {
        uVar15 = uVar31;
      }
      uVar9 = zip->codec2;
      sVar13 = uVar30;
      outBuf = puVar7;
      if (uVar9 != 0x3030103 || zip->codec == 0x21) {
LAB_00166a13:
        outSize = sVar13;
        puVar27 = outBuf;
        if (uVar9 == 0x303011b) {
          sVar32 = zip->tmp_stream_bytes_remaining;
          if (sVar32 != 0) {
            sVar10 = Bcj2_Decode(zip,outBuf,sVar13);
            if (sVar10 < 0) {
              pcVar17 = "BCJ2 conversion Failed";
              iVar21 = -1;
              goto LAB_00167589;
            }
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar32);
            outSize = sVar13 - sVar10;
            if ((uVar31 == 0) || (outSize == 0)) {
              uVar26 = uVar30 - outSize;
              local_d8 = 0;
              if (uVar31 == 0) {
                local_d8 = (uint)(zip->tmp_stream_bytes_remaining != 0);
              }
              uVar8 = 0;
              goto LAB_001673ed;
            }
            outBuf = outBuf + sVar10;
          }
          sVar13 = zip->tmp_stream_buff_size;
          puVar27 = zip->tmp_stream_buff;
        }
        uVar9 = zip->codec;
        if (uVar9 == 0x4f71101) {
          input.pos = 0;
          local_50 = 0;
          local_60 = puVar27;
          local_58 = sVar13;
          input.src = __src;
          input.size = uVar15;
          uVar11 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&input);
          iVar21 = ZSTD_isError();
          if (iVar21 != 0) {
            uVar11 = ZSTD_getErrorName(uVar11);
            archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",uVar11);
            return -0x1e;
          }
          sVar32 = uVar15 - input.pos;
          sVar13 = sVar13 - local_50;
          uVar14 = 0;
LAB_00166c7e:
          uVar26 = uVar30 - sVar13;
          local_d8 = (uint)uVar14;
          local_78 = sVar13;
          if (zip->codec == 0x21) {
LAB_00167363:
            uVar9 = zip->codec2;
          }
          else {
            uVar9 = zip->codec2;
            lVar23 = sVar3 + 3;
            if (uVar9 == 0x3030805) {
              iVar21 = 0;
              for (uVar31 = 0; uVar31 < (uVar26 & 0xfffffffffffffffc); uVar31 = uVar31 + 4) {
                uVar19 = (uint)puVar2[uVar31 + sVar3 + 1] * 0x10000 +
                         (uint)puVar2[uVar31 + sVar3] * 0x1000000 >> 0x16;
                if ((uVar19 == 0x1ff) || (uVar19 == 0x100)) {
                  uVar19 = (((uint)puVar2[uVar31 + sVar3] * 0x1000000 +
                             (uint)puVar2[uVar31 + sVar3 + 1] * 0x10000 +
                            (uint)puVar2[uVar31 + lVar23] + (uint)puVar2[uVar31 + sVar3 + 2] * 0x100
                            ) * 4 - zip->bcj_ip) + iVar21;
                  uVar20 = uVar19 >> 2;
                  iVar22 = 0x40000000 - (uVar20 & 0x400000);
                  puVar2[uVar31 + sVar3] = (byte)((uint)iVar22 >> 0x18) | 0x40;
                  puVar2[uVar31 + sVar3 + 1] =
                       (byte)(uVar20 >> 0x10) & 0x3f | (byte)((uint)iVar22 >> 0x10);
                  puVar2[uVar31 + sVar3 + 2] = (uchar)(uVar19 >> 10);
                  puVar2[uVar31 + lVar23] = (uchar)uVar20;
                }
                iVar21 = iVar21 + -4;
              }
LAB_001670b4:
              zip->bcj_ip = zip->bcj_ip + (int)uVar31;
              uVar26 = uVar31;
              goto LAB_00167363;
            }
            if (uVar9 == 0x3030103) {
              if (uVar26 < 5) {
                uVar24 = 0;
              }
              else {
                local_f0 = (ulong)zip->bcj_prevMask;
                iVar21 = -zip->bcj_ip;
                bVar18 = -(char)zip->bcj_ip;
                uVar14 = 0;
                uVar25 = zip->bcj_prevPosT;
                while( true ) {
                  uVar24 = uVar14;
                  iVar22 = (int)uVar24;
                  uVar6 = (uint32_t)local_f0;
                  if (puVar7 + (uVar26 - 4) <= puVar7 + uVar24) break;
                  if ((puVar7[uVar24] & 0xfe) == 0xe8) {
                    local_f0 = 0;
                    if (uVar24 - uVar25 < 4) {
                      uVar19 = uVar6 << (~(byte)uVar25 + (char)uVar24 & 0x1f) & 7;
                      if ((uVar19 == 0) ||
                         (((0xe8U >> uVar19 & 1) == 0 &&
                          (local_f0 = (ulong)uVar19,
                          (byte)(puVar7[uVar24 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar19))] -
                                1) < 0xfe)))) goto LAB_0016720c;
LAB_001672f1:
                      local_f0 = (ulong)((uVar19 & 3) * 2 + 1);
                      lVar23 = 1;
                    }
                    else {
LAB_0016720c:
                      bVar1 = puVar7[uVar24 + 4];
                      uVar19 = (uint)local_f0;
                      if ((bVar1 != 0xff) && (bVar1 != 0)) goto LAB_001672f1;
                      uVar20 = (uint)puVar7[uVar24 + 1] |
                               (uint)puVar7[uVar24 + 2] << 8 |
                               (uint)puVar7[uVar24 + 3] << 0x10 | (uint)bVar1 << 0x18;
                      while (uVar19 != 0) {
                        uVar29 = uVar20 + (iVar21 - iVar22);
                        uVar28 = uVar29 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber + local_f0
                                                     ) * -8 + 0x18U & 0x1f);
                        if (((char)uVar28 != -1) && ((uVar28 & 0xff) != 0)) break;
                        uVar20 = ~(uVar29 ^ -1 << (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                            local_f0) * -8 & 0x1fU));
                      }
                      iVar22 = (iVar21 + uVar20) - iVar22;
                      puVar7[uVar24 + 4] = (uchar)(iVar22 * 0x80 >> 0x1f);
                      puVar7[uVar24 + 3] = (uchar)((uint)iVar22 >> 0x10);
                      puVar7[uVar24 + 2] = (uchar)((uint)iVar22 >> 8);
                      puVar7[uVar24 + 1] = ((char)uVar20 + bVar18) - (char)uVar24;
                      lVar23 = 5;
                      local_a8 = (ulong)bVar18;
                    }
                    uVar14 = lVar23 + uVar24;
                    uVar25 = uVar24;
                  }
                  else {
                    uVar14 = uVar24 + 1;
                  }
                }
                zip->bcj_prevPosT = uVar25;
                zip->bcj_prevMask = uVar6;
                zip->bcj_ip = zip->bcj_ip + iVar22;
              }
              sVar16 = uVar26 - uVar24;
              zip->odd_bcj_size = sVar16;
              if ((((sVar16 == 0) || (local_d8 == 1)) || (4 < sVar16)) || (uVar31 == 0)) {
                zip->odd_bcj_size = 0;
              }
              else {
                memcpy(local_a0,puVar7 + uVar24,sVar16);
                uVar26 = uVar24;
              }
              goto LAB_00167363;
            }
            if (uVar9 == 0x3030205) {
              iVar21 = 0;
              for (uVar31 = 0; uVar31 < (uVar26 & 0xfffffffffffffffc); uVar31 = uVar31 + 4) {
                if ((puVar2[uVar31 + sVar3] & 0xfc) == 0x48) {
                  bVar18 = puVar2[uVar31 + lVar23];
                  if ((bVar18 & 3) == 1) {
                    uVar6 = zip->bcj_ip;
                    iVar22 = ((bVar18 & 0xfffffffc |
                              (uint)puVar2[uVar31 + sVar3 + 2] << 8 |
                              (uint)puVar2[uVar31 + sVar3 + 1] << 0x10 |
                              (puVar2[uVar31 + sVar3] & 3) << 0x18) - uVar6) + iVar21;
                    puVar2[uVar31 + sVar3] = (byte)((uint)iVar22 >> 0x18) & 3 | 0x48;
                    puVar2[uVar31 + sVar3 + 1] = (uchar)((uint)iVar22 >> 0x10);
                    puVar2[uVar31 + sVar3 + 2] = (uchar)((uint)iVar22 >> 8);
                    puVar2[uVar31 + lVar23] =
                         ((bVar18 & 0xfc) - (char)uVar6) + (char)iVar21 | bVar18 & 3;
                  }
                }
                iVar21 = iVar21 + -4;
              }
              goto LAB_001670b4;
            }
            if (uVar9 == 0x3030501) {
              lVar23 = 0;
              for (uVar31 = 4; uVar31 <= uVar26; uVar31 = uVar31 + 4) {
                if (puVar7[uVar31 - 1] == 0xeb) {
                  uVar19 = ((((uint)puVar7[uVar31 - 3] << 10 | (uint)puVar7[uVar31 - 2] << 0x12) +
                            (uint)puVar7[uVar31 - 4] * 4) - zip->bcj_ip) + (int)lVar23;
                  puVar7[uVar31 - 4] = (uchar)(uVar19 >> 2);
                  puVar7[uVar31 - 3] = (uchar)(uVar19 >> 10);
                  puVar7[uVar31 - 2] = (uchar)(uVar19 >> 0x12);
                }
                lVar23 = lVar23 + -4;
              }
              zip->bcj_ip = zip->bcj_ip - (int)lVar23;
              uVar26 = -lVar23;
              goto LAB_00167363;
            }
            if (uVar9 == 10) {
              uVar14 = 0;
LAB_00166d0a:
              uVar31 = uVar14;
              uVar14 = uVar31 + 4;
              if (uVar14 <= uVar26) {
                bVar18 = puVar2[uVar31 + sVar3];
                uVar19 = (uint)puVar2[uVar31 + sVar3 + 2] << 0x10 |
                         (uint)puVar2[uVar31 + sVar3 + 1] << 8;
                uVar20 = uVar19 | bVar18;
                bVar1 = puVar2[uVar31 + lVar23];
                if ((bVar1 & 0xfc) != 0x94) goto LAB_00166d79;
                iVar21 = (uVar20 | (uint)bVar1 << 0x18) - (zip->bcj_ip + (int)uVar31 >> 2);
                puVar2[uVar31 + sVar3] = (uchar)iVar21;
                puVar2[uVar31 + sVar3 + 1] = (uchar)((uint)iVar21 >> 8);
                puVar2[uVar31 + sVar3 + 2] = (uchar)((uint)iVar21 >> 0x10);
                bVar18 = (byte)((uint)iVar21 >> 0x18) & 3 | 0x94;
                goto LAB_00166d74;
              }
              goto LAB_001670b4;
            }
          }
          if (uVar9 == 0x303011b) {
            uVar31 = zip->tmp_stream_buff_size - local_78;
            if (zip->main_stream_bytes_remaining <= uVar31) {
              uVar31 = zip->main_stream_bytes_remaining;
            }
            zip->tmp_stream_bytes_avail = uVar31;
            zip->tmp_stream_bytes_remaining = uVar31;
            sVar10 = Bcj2_Decode(zip,outBuf,outSize);
            if (sVar10 < 0) {
              pcVar17 = "BCJ2 conversion Failed";
              goto LAB_00167492;
            }
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining +
                 (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
            uVar26 = (uVar30 - outSize) + sVar10;
          }
          if (1 < local_d8) {
            return -0x1e;
          }
          uVar8 = uVar15 - sVar32;
          goto LAB_001673ed;
        }
        if ((uVar9 == 0x21) || (uVar9 == 0x30101)) {
          (zip->lzstream).next_in = __src;
          (zip->lzstream).avail_in = uVar15;
          (zip->lzstream).next_out = puVar27;
          (zip->lzstream).avail_out = sVar13;
          uVar19 = lzma_code(&zip->lzstream,0);
          uVar14 = (ulong)uVar19;
          if (uVar19 != 0) {
            if (uVar19 != 1) {
              pcVar17 = "Decompression failed(%d)";
LAB_001675b9:
              archive_set_error(&a->archive,-1,pcVar17);
              return -0x1e;
            }
            lzma_end();
            zip->lzstream_valid = 0;
          }
          sVar32 = (zip->lzstream).avail_in;
          sVar13 = (zip->lzstream).avail_out;
          goto LAB_00166c7e;
        }
        if (uVar9 != 0x30401) {
          if (uVar9 == 0x40108) {
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uInt)uVar15;
            (zip->stream).next_out = puVar27;
            (zip->stream).avail_out = (uInt)sVar13;
            uVar19 = inflate(local_80,0);
            uVar14 = (ulong)uVar19;
            if (1 < uVar19) {
              pcVar17 = "File decompression failed (%d)";
              goto LAB_001675b9;
            }
            sVar32 = (size_t)(zip->stream).avail_in;
            sVar13 = (size_t)(zip->stream).avail_out;
          }
          else {
            if (uVar9 != 0) goto LAB_00167563;
            uVar26 = sVar13;
            if (uVar15 < sVar13) {
              uVar26 = uVar15;
            }
            memcpy(puVar27,__src,uVar26);
            sVar32 = uVar15 - uVar26;
            sVar13 = sVar13 - uVar26;
            uVar14 = (ulong)(uVar31 == 0);
          }
          goto LAB_00166c7e;
        }
        if (((zip->ppmd7_valid != 0) && (iVar21 = zip->ppmd7_stat, -1 < iVar21)) && (sVar13 != 0)) {
          (zip->ppstream).next_in = __src;
          (zip->ppstream).avail_in = uVar15;
          (zip->ppstream).stream_in = 0;
          (zip->ppstream).next_out = puVar27;
          (zip->ppstream).avail_out = sVar13;
          if (iVar21 == 0) {
            (zip->bytein).a = a;
            (zip->bytein).Read = ppmd_read;
            (zip->range_dec).Stream = local_90;
            BVar5 = (*local_98)(&zip->range_dec);
            if (BVar5 == 0) {
              zip->ppmd7_stat = -1;
              pcVar17 = "Failed to initialize PPMd range decoder";
              goto LAB_00167492;
            }
            if ((zip->ppstream).overconsumed != 0) {
LAB_00167546:
              zip->ppmd7_stat = -1;
              return -0x1e;
            }
            zip->ppmd7_stat = 1;
          }
          if (uVar31 == 0) {
            uVar26 = zip->folder_outbytes_remaining;
          }
          else {
            uVar26 = 0;
          }
          do {
            uVar25 = uVar26;
            iVar21 = (*local_68)(local_70,&(zip->range_dec).p);
            if (iVar21 < 0) {
              zip->ppmd7_stat = -1;
              pcVar17 = "Failed to decode PPMd";
              iVar21 = 0x54;
              goto LAB_00167589;
            }
            if ((zip->ppstream).overconsumed != 0) goto LAB_00167546;
            puVar27 = (zip->ppstream).next_out;
            (zip->ppstream).next_out = puVar27 + 1;
            *puVar27 = (uchar)iVar21;
            sVar13 = (zip->ppstream).avail_out - 1;
            (zip->ppstream).avail_out = sVar13;
            (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
            sVar32 = (zip->ppstream).avail_in;
            uVar14 = 0;
            if (sVar13 == 0) {
              sVar13 = 0;
              break;
            }
            uVar26 = uVar25 - 1;
            if (uVar25 == 0) {
              uVar26 = uVar14;
            }
          } while ((sVar32 != 0) || (sVar32 = 0, 1 < uVar25));
          goto LAB_00166c7e;
        }
LAB_00167563:
        pcVar17 = "Decompression internal error";
LAB_00167492:
        iVar21 = -1;
        goto LAB_00167589;
      }
      sVar13 = zip->odd_bcj_size;
      if (uVar30 < 5 && uVar31 != 0) {
        local_d8 = 0;
        uVar26 = 0;
        uVar8 = 0;
        bVar33 = sVar13 == 0;
        sVar13 = 0;
        if (bVar33) goto LAB_001669b8;
      }
      else {
LAB_001669b8:
        for (uVar26 = 0; (sVar13 != 0 && (uVar30 != uVar26)); uVar26 = uVar26 + 1) {
          puVar7[uVar26] = zip->odd_bcj[uVar26];
          sVar13 = zip->odd_bcj_size - 1;
          zip->odd_bcj_size = sVar13;
        }
        sVar13 = uVar30 - uVar26;
        if (sVar13 != 0 && uVar31 != 0) {
          outBuf = puVar7 + uVar26;
          uVar9 = zip->codec2;
          goto LAB_00166a13;
        }
        local_d8 = (uint)(uVar31 == 0);
        uVar8 = 0;
      }
LAB_001673ed:
      uVar4 = zip->pack_stream_inbytes_remaining;
      zip->pack_stream_inbytes_remaining = uVar4 - uVar8;
      uVar31 = zip->folder_outbytes_remaining;
      uVar15 = uVar31;
      if (uVar26 < uVar31) {
        uVar15 = uVar26;
      }
      zip->folder_outbytes_remaining = uVar31 - uVar15;
      uVar30 = zip->uncompressed_buffer_bytes_remaining + uVar15;
      zip->uncompressed_buffer_bytes_remaining = uVar30;
      zip->pack_stream_bytes_unconsumed = uVar8;
      if ((uVar30 == zip->uncompressed_buffer_size) ||
         ((((zip->codec2 == 0x3030103 && (zip->uncompressed_buffer_size < uVar30 + 5)) &&
           (zip->odd_bcj_size != 0)) || ((uVar4 == uVar8 && (uVar31 <= uVar26)))))) {
        if (local_88 <= uVar30) {
          zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
          return 0;
        }
LAB_0016748b:
        pcVar17 = "Damaged 7-Zip archive";
        goto LAB_00167492;
      }
      if ((local_d8 != 0) || (uVar15 == 0 && uVar8 == 0)) goto LAB_0016748b;
      read_consume(a);
    }
    pcVar17 = "Truncated 7-Zip file body";
    iVar21 = 0x54;
LAB_00167589:
    archive_set_error(&a->archive,iVar21,pcVar17);
  }
  return -0x1e;
LAB_00166d79:
  if (((bVar1 & 0x9f) == 0x90) && (((uVar20 >> 3) + 0x20000 & 0x1c0000) == 0)) {
    uVar19 = (bVar1 >> 5 & 3 | (uVar19 | bVar18 & 0xffffffe0) >> 3) -
             (zip->bcj_ip + (int)uVar31 >> 0xc);
    uVar20 = uVar19 * 8 & 0x1fffe0;
    puVar2[uVar31 + sVar3] = bVar18 & 0x1f | (byte)uVar20;
    puVar2[uVar31 + sVar3 + 1] = (uchar)(uVar19 >> 5);
    puVar2[uVar31 + sVar3 + 2] = (byte)(-(uVar19 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar20 >> 0x10)
    ;
    bVar18 = (char)uVar19 << 5 | 0x90;
LAB_00166d74:
    puVar2[uVar31 + lVar23] = bVar18;
  }
  goto LAB_00166d0a;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}